

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight.cpp
# Opt level: O2

void gl_ParsePulseLight(FScanner *sc)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  FLightDefaults *defaults;
  uchar uVar5;
  uint uVar6;
  float fVar7;
  float floatTriple [3];
  FName name;
  
  FScanner::GetString(sc);
  FName::FName(&name,sc->String);
  FScanner::GetString(sc);
  bVar2 = FScanner::Compare(sc,"{");
  if (bVar2) {
    defaults = (FLightDefaults *)operator_new(0x38);
    (defaults->m_Name).Index = name.Index;
    defaults->m_type = PulseLight;
    defaults->m_subtractive = false;
    defaults->m_additive = false;
    defaults->m_halo = false;
    defaults->m_dontlightself = false;
    defaults->m_Args[4] = '\0';
    defaults->m_Args[0] = '\0';
    defaults->m_Args[1] = '\0';
    defaults->m_Args[2] = '\0';
    defaults->m_Args[3] = '\0';
    (defaults->m_Pos).Y = 0.0;
    (defaults->m_Pos).Z = 0.0;
    defaults->m_Param = 0.0;
    (defaults->m_Pos).X = 0.0;
    ScriptDepth = ScriptDepth + 1;
    while (ScriptDepth != 0) {
      FScanner::GetString(sc);
      iVar3 = FScanner::MatchString(sc,LightTags,8);
      switch(iVar3) {
      case 0:
        gl_ParseTriple(sc,floatTriple);
        iVar3 = (int)(floatTriple[0] * 255.0);
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        defaults->m_Args[0] = (uchar)iVar3;
        iVar3 = (int)(floatTriple[1] * 255.0);
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        defaults->m_Args[1] = (uchar)iVar3;
        iVar3 = (int)(floatTriple[2] * 255.0);
        if (0xfe < iVar3) {
          iVar3 = 0xff;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        defaults->m_Args[2] = (uchar)iVar3;
        break;
      case 1:
        uVar4 = gl_ParseInt(sc);
        uVar6 = 0xff;
        if (uVar4 < 0xff) {
          uVar6 = uVar4;
        }
        uVar5 = (uchar)uVar6;
        if ((int)uVar4 < 1) {
          uVar5 = '\0';
        }
        defaults->m_Args[3] = uVar5;
        break;
      case 2:
        uVar4 = gl_ParseInt(sc);
        uVar6 = 0xff;
        if (uVar4 < 0xff) {
          uVar6 = uVar4;
        }
        uVar5 = (uchar)uVar6;
        if ((int)uVar4 < 1) {
          uVar5 = '\0';
        }
        defaults->m_Args[4] = uVar5;
        break;
      case 3:
        gl_ParseTriple(sc,floatTriple);
        (defaults->m_Pos).Z = (double)floatTriple[1];
        auVar1._8_4_ = SUB84((double)floatTriple[2],0);
        auVar1._0_8_ = (double)floatTriple[0];
        auVar1._12_4_ = (int)((ulong)(double)floatTriple[2] >> 0x20);
        (defaults->m_Pos).X = (double)floatTriple[0];
        (defaults->m_Pos).Y = (double)auVar1._8_8_;
        break;
      default:
        FScanner::ScriptError(sc,"Unknown tag: %s\n",sc->String);
        break;
      case 5:
        fVar7 = gl_ParseFloat(sc);
        defaults->m_Param = (double)(fVar7 * 35.0);
        break;
      case 9:
        ScriptDepth = ScriptDepth + 1;
        break;
      case 10:
        ScriptDepth = ScriptDepth + -1;
        break;
      case 0xb:
        iVar3 = gl_ParseInt(sc);
        defaults->m_subtractive = iVar3 != 0;
        break;
      case 0xd:
        iVar3 = gl_ParseInt(sc);
        defaults->m_halo = iVar3 != 0;
        break;
      case 0xe:
        iVar3 = gl_ParseInt(sc);
        defaults->m_dontlightself = iVar3 != 0;
      }
    }
    gl_AddLightDefaults(defaults);
  }
  else {
    FScanner::ScriptError(sc,"Expected \'{\'.\n");
  }
  return;
}

Assistant:

void gl_ParsePulseLight(FScanner &sc)
{
	int type;
	float floatVal, floatTriple[3];
	int intVal;
	FLightDefaults *defaults;

	// get name
	sc.GetString();
	FName name = sc.String;

	// check for opening brace
	sc.GetString();
	if (sc.Compare("{"))
	{
		defaults = new FLightDefaults(name, PulseLight);
		ScriptDepth++;
		while (ScriptDepth)
		{
			sc.GetString();
			type = sc.MatchString(LightTags);
			switch (type)
			{
			case LIGHTTAG_OPENBRACE:
				ScriptDepth++;
				break;
			case LIGHTTAG_CLOSEBRACE:
				ScriptDepth--;
				break;
			case LIGHTTAG_COLOR:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetArg(LIGHT_RED, clamp<int>((int)(floatTriple[0] * 255), 0, 255));
				defaults->SetArg(LIGHT_GREEN, clamp<int>((int)(floatTriple[1] * 255), 0, 255));
				defaults->SetArg(LIGHT_BLUE, clamp<int>((int)(floatTriple[2] * 255), 0, 255));
				break;
			case LIGHTTAG_OFFSET:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetOffset(floatTriple);
				break;
			case LIGHTTAG_SIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_INTENSITY, intVal);
				break;
			case LIGHTTAG_SECSIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_SECONDARY_INTENSITY, intVal);
				break;
			case LIGHTTAG_INTERVAL:
				floatVal = gl_ParseFloat(sc);
				defaults->SetParameter(floatVal * TICRATE);
				break;
			case LIGHTTAG_SUBTRACTIVE:
				defaults->SetSubtractive(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_HALO:
				defaults->SetHalo(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_DONTLIGHTSELF:
				defaults->SetDontLightSelf(gl_ParseInt(sc) != 0);
				break;
			default:
				sc.ScriptError("Unknown tag: %s\n", sc.String);
			}
		}
		gl_AddLightDefaults(defaults);
	}
	else
	{
		sc.ScriptError("Expected '{'.\n");
	}
}